

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImS8 IVar3;
  uint in_EDX;
  float *in_RSI;
  ImGuiWindow *in_RDI;
  ImVec2 old_size;
  float local_1c;
  float fStack_18;
  
  if ((in_EDX == 0) || (((*(int *)&in_RDI->field_0xf0 << 0x10) >> 0x18 & in_EDX) != 0)) {
    *(uint *)&in_RDI->field_0xf0 =
         *(uint *)&in_RDI->field_0xf0 & 0xffff00ff |
         ((*(int *)&in_RDI->field_0xf0 << 0x10) >> 0x18 & 0xf1U) << 8;
    if (((in_RDI->Flags & 0x1000000U) == 0) ||
       (((in_RDI->Appearing & 1U) != 0 || ((in_RDI->ChildFlags & 0x40U) != 0)))) {
      IVar3 = '\0';
      if (*in_RSI <= 0.0) {
        IVar3 = '\x02';
      }
      in_RDI->AutoFitFramesX = IVar3;
    }
    if ((((in_RDI->Flags & 0x1000000U) == 0) || ((in_RDI->Appearing & 1U) != 0)) ||
       ((in_RDI->ChildFlags & 0x40U) != 0)) {
      IVar3 = '\0';
      if (in_RSI[1] <= 0.0) {
        IVar3 = '\x02';
      }
      in_RDI->AutoFitFramesY = IVar3;
    }
    IVar2 = in_RDI->SizeFull;
    if (0.0 < *in_RSI) {
      (in_RDI->SizeFull).x = (float)(int)*in_RSI;
    }
    else {
      in_RDI->AutoFitOnlyGrows = false;
    }
    if (0.0 < in_RSI[1]) {
      (in_RDI->SizeFull).y = (float)(int)in_RSI[1];
    }
    else {
      in_RDI->AutoFitOnlyGrows = false;
    }
    local_1c = IVar2.x;
    if ((local_1c == (in_RDI->SizeFull).x) && (!NAN(local_1c) && !NAN((in_RDI->SizeFull).x))) {
      fStack_18 = IVar2.y;
      pfVar1 = &(in_RDI->SizeFull).y;
      if ((fStack_18 == *pfVar1) && (!NAN(fStack_18) && !NAN(*pfVar1))) {
        return;
      }
    }
    MarkIniSettingsDirty(in_RDI);
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Enable auto-fit (not done in BeginChild() path unless appearing or combined with ImGuiChildFlags_AlwaysAutoResize)
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesX = (size.x <= 0.0f) ? 2 : 0;
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesY = (size.y <= 0.0f) ? 2 : 0;

    // Set
    ImVec2 old_size = window->SizeFull;
    if (size.x <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.x = IM_TRUNC(size.x);
    if (size.y <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.y = IM_TRUNC(size.y);
    if (old_size.x != window->SizeFull.x || old_size.y != window->SizeFull.y)
        MarkIniSettingsDirty(window);
}